

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::BeginCustomSection(BinaryWriter *this,char *name)

{
  Stream *stream;
  size_t size;
  char desc [100];
  char acStack_88 [112];
  
  snprintf(acStack_88,100,"section \"%s\"",name);
  WriteSectionHeader(this,acStack_88,Custom);
  stream = this->stream_;
  size = strlen(name);
  WriteU32Leb128(stream,(uint32_t)size,"string length");
  Stream::WriteData(stream,name,size,"custom section name",Yes);
  return;
}

Assistant:

void BinaryWriter::BeginCustomSection(const char* name) {
  char desc[100];
  wabt_snprintf(desc, sizeof(desc), "section \"%s\"", name);
  WriteSectionHeader(desc, BinarySection::Custom);
  WriteStr(stream_, name, "custom section name", PrintChars::Yes);
}